

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::uint64_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
          (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this,
          short_string_storage *param_2)

{
  undefined8 uVar1;
  short_string_storage temp;
  short_string_storage sStack_28;
  
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::short_string_storage::
  short_string_storage(&sStack_28,param_2);
  uVar1 = *(undefined8 *)(this + 8);
  *(undefined8 *)param_2 = *(undefined8 *)this;
  *(undefined8 *)(param_2->data_ + 6) = uVar1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::short_string_storage::
  short_string_storage((short_string_storage *)this,&sStack_28);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }